

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O0

void __thiscall xLearn::AUCMetric::Info::Info(Info *this)

{
  size_type in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *unaff_retaddr;
  uint in_stack_fffffffffffffff0;
  undefined4 uVar1;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x20166f);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x201682);
  uVar1 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (unaff_retaddr,in_RDI,(value_type_conflict2 *)(ulong)in_stack_fffffffffffffff0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (unaff_retaddr,in_RDI,(value_type_conflict2 *)CONCAT44(uVar1,in_stack_fffffffffffffff0))
  ;
  return;
}

Assistant:

Info() {
      positive_vec_.resize(kMaxBucketSize, 0);
      negative_vec_.resize(kMaxBucketSize, 0);
    }